

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void WriteVarInt<DataStream,(VarIntMode)1,short>(DataStream *os,short n)

{
  ulong uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  uchar tmp [3];
  byte local_2c;
  byte local_2b [3];
  long local_28;
  
  uVar3 = CONCAT62(in_register_00000032,n);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2b[0] = (byte)n & 0x7f;
  if ((int)uVar3 < 0x80) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar1 = uVar3 & 0xffff;
      uVar2 = (int)(uVar1 >> 7) - 1;
      uVar3 = (ulong)uVar2;
      local_2b[uVar4 + 1] = (byte)uVar2 | 0x80;
      uVar4 = uVar4 + 1;
    } while (0x407f < (uint)uVar1);
    uVar4 = uVar4 & 0xffffffff;
  }
  do {
    local_2c = local_2b[uVar4];
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os,
               (os->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_2c,local_2b);
    bVar5 = uVar4 != 0;
    uVar4 = uVar4 - 1;
  } while (bVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}